

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SnippetScore(Fts5ExtensionApi *pApi,Fts5Context *pFts,int nDocsize,uchar *aSeen,int iCol,
                    int iPos,int nToken,int *pnScore,int *piPos)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  sqlite3_int64 iAdj;
  sqlite3_int64 iEnd;
  int iLast;
  int nScore;
  int iFirst;
  int i;
  int rc;
  int nInst;
  int iOff;
  int ic;
  int ip;
  long local_68;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  local_10 = 0;
  local_14 = 0;
  local_4c = -1;
  local_18 = -0x55555556;
  local_50 = 0;
  local_54 = 0;
  local_44 = (**(code **)(in_RDI + 0x40))(in_RSI,&local_18);
  for (local_48 = 0; local_48 < local_18 && local_44 == 0; local_48 = local_48 + 1) {
    local_44 = (**(code **)(in_RDI + 0x48))(in_RSI,local_48,&local_c,&local_10,&local_14);
    iVar1 = local_14;
    if ((((local_44 == 0) && (local_10 == in_R8D)) && (in_R9D <= local_14)) &&
       ((long)local_14 < (long)in_R9D + (long)in_stack_00000008)) {
      iVar2 = 1000;
      if (*(char *)(in_RCX + local_c) != '\0') {
        iVar2 = 1;
      }
      local_50 = iVar2 + local_50;
      *(undefined1 *)(in_RCX + local_c) = 1;
      if (local_4c < 0) {
        local_4c = local_14;
      }
      local_54 = (**(code **)(in_RDI + 0x38))(in_RSI,local_c);
      local_54 = iVar1 + local_54;
    }
  }
  *(int *)iAdj = local_50;
  if (iEnd != 0) {
    local_68 = (long)(local_4c - (in_stack_00000008 - (local_54 - local_4c)) / 2);
    if ((long)in_EDX < local_68 + in_stack_00000008) {
      local_68 = (long)(in_EDX - in_stack_00000008);
    }
    if (local_68 < 0) {
      local_68 = 0;
    }
    *(int *)iEnd = (int)local_68;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5SnippetScore(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  int nDocsize,                   /* Size of column in tokens */
  unsigned char *aSeen,           /* Array with one element per query phrase */
  int iCol,                       /* Column to score */
  int iPos,                       /* Starting offset to score */
  int nToken,                     /* Max tokens per snippet */
  int *pnScore,                   /* OUT: Score */
  int *piPos                      /* OUT: Adjusted offset */
){
  int rc;
  int i;
  int ip = 0;
  int ic = 0;
  int iOff = 0;
  int iFirst = -1;
  int nInst;
  int nScore = 0;
  int iLast = 0;
  sqlite3_int64 iEnd = (sqlite3_int64)iPos + nToken;

  rc = pApi->xInstCount(pFts, &nInst);
  for(i=0; i<nInst && rc==SQLITE_OK; i++){
    rc = pApi->xInst(pFts, i, &ip, &ic, &iOff);
    if( rc==SQLITE_OK && ic==iCol && iOff>=iPos && iOff<iEnd ){
      nScore += (aSeen[ip] ? 1 : 1000);
      aSeen[ip] = 1;
      if( iFirst<0 ) iFirst = iOff;
      iLast = iOff + pApi->xPhraseSize(pFts, ip);
    }
  }

  *pnScore = nScore;
  if( piPos ){
    sqlite3_int64 iAdj = iFirst - (nToken - (iLast-iFirst)) / 2;
    if( (iAdj+nToken)>nDocsize ) iAdj = nDocsize - nToken;
    if( iAdj<0 ) iAdj = 0;
    *piPos = (int)iAdj;
  }

  return rc;
}